

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

void __thiscall nuraft::snapshot_io_mgr::async_io_loop(snapshot_io_mgr *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  pthread_t __target_thread;
  char *__name;
  element_type *this_00;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *this_01;
  snapshot_sync_req *this_02;
  long in_RDI;
  shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *entry_2;
  iterator __end3_1;
  iterator __begin3_1;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *__range3_1;
  iterator e2;
  shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *entry_1;
  iterator __end3;
  iterator __begin3;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *__range3;
  lock_guard<std::mutex> guard_3;
  ptr<req_msg> req;
  unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_> sync_req;
  ulong commit_idx;
  ulong term;
  unique_lock<std::recursive_mutex> guard_1;
  iterator entry;
  unique_lock<std::recursive_mutex> guard_2;
  int rc;
  bool is_last_request;
  ptr<buffer> data;
  ulong snp_log_term;
  ulong snp_log_idx;
  void **user_snp_ctx;
  ulong obj_idx;
  logger *l_;
  unique_lock<std::mutex> lock;
  int dst_id;
  ptr<io_queue_elem> *elem;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *__range2;
  lock_guard<std::mutex> guard;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs_to_return;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs;
  string thread_name;
  raft_server *in_stack_fffffffffffffc08;
  peer *in_stack_fffffffffffffc10;
  const_iterator in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  undefined8 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  unsigned_long *in_stack_fffffffffffffc50;
  element_type *in_stack_fffffffffffffc58;
  raft_server *in_stack_fffffffffffffc60;
  peer *in_stack_fffffffffffffc98;
  raft_server *in_stack_fffffffffffffca0;
  _Self local_2b8;
  _Self local_2b0;
  __pthread_list_t *local_2a8;
  _List_node_base *local_2a0;
  _List_const_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_> local_298;
  _List_node_base *local_290;
  _Self local_288;
  _Self local_280;
  reference local_278;
  _Self local_270;
  _Self local_268;
  __pthread_internal_list *local_260;
  string local_250 [8];
  rpc_handler *in_stack_fffffffffffffdb8;
  ptr<req_msg> *in_stack_fffffffffffffdc0;
  ptr<peer> *in_stack_fffffffffffffdc8;
  peer *in_stack_fffffffffffffdd0;
  undefined1 local_1e0 [56];
  undefined1 local_1a8 [84];
  int32 local_154;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_150;
  undefined1 local_148 [56];
  int local_110;
  undefined1 local_109;
  __shared_ptr local_108 [16];
  atomic<unsigned_long> local_f8;
  ulong local_f0;
  string local_e8 [32];
  void **local_c8;
  __native_type local_c0;
  reference local_98;
  _Self local_90;
  undefined1 local_88 [48];
  __pthread_internal_list local_58 [2];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"nuraft_snp_io",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  __target_thread = pthread_self();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(__target_thread,__name);
  do {
    std::__shared_ptr_access<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x230f6a);
    EventAwaiter::wait_ms
              ((EventAwaiter *)in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
    std::__shared_ptr_access<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x230f8a);
    EventAwaiter::reset((EventAwaiter *)0x230f92);
    std::__cxx11::
    list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::list((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
            *)0x230fa1);
    std::__cxx11::
    list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::list((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
            *)0x230fae);
    bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc18._M_node);
    if (!bVar2) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffc10,
                 (mutex_type *)in_stack_fffffffffffffc08);
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::operator=((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   *)in_stack_fffffffffffffc30,
                  (list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x23100a);
    }
    local_88._8_8_ = local_58;
    local_88._0_8_ =
         std::__cxx11::
         list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
         ::begin((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                  *)in_stack_fffffffffffffc08);
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
         ::end((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)in_stack_fffffffffffffc08);
    while (bVar2 = std::operator!=((_Self *)&((__native_type *)local_88)->__data,&local_90), bVar2)
    {
      local_98 = std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::
                 operator*((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>
                            *)0x2310ef);
      bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc18._M_node);
      if (bVar2) break;
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231120);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x231128);
      bVar2 = raft_server::is_leader(in_stack_fffffffffffffc08);
      if (!bVar2) break;
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231158);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x231164);
      local_c0._36_4_ = peer::get_id((peer *)0x23116c);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231190);
      this_00 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x23119c);
      peer::get_lock(this_00);
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffc10,
                 (mutex_type *)in_stack_fffffffffffffc08);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2311d2);
      peVar4 = std::
               __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2311da);
      local_c0._8_8_ =
           std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar4->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2311fe);
      peVar5 = std::
               __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x23120a);
      local_c0.__align = snapshot_sync_ctx::get_offset(peVar5);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231239);
      peVar5 = std::
               __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x231245);
      local_c8 = snapshot_sync_ctx::get_user_snp_ctx(peVar5);
      if (((peer *)local_c0._8_8_ != (peer *)0x0) &&
         (iVar3 = (*(*(_func_int ***)local_c0._8_8_)[7])(), uVar1 = local_c0._8_8_, 4 < iVar3)) {
        msg_if_given_abi_cxx11_
                  ((char *)local_e8,"peer: %d, obj_idx: %lu, user_snp_ctx %p",
                   (ulong)(uint)local_c0.__data.__list.__next._4_4_,local_c0._0_8_,*local_c8);
        (*(*(_func_int ***)uVar1)[8])
                  (uVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                   ,"async_io_loop",0xb8,local_e8);
        std::__cxx11::string::~string(local_e8);
      }
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231371);
      peVar6 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x23137d);
      local_f0 = snapshot::get_last_log_idx(peVar6);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2313ac);
      peVar6 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2313b8);
      local_f8.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)snapshot::get_last_log_term(peVar6);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffc10);
      std::shared_ptr<nuraft::buffer>::shared_ptr
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      local_109 = 0;
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231417);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x23141f);
      peVar7 = std::
               __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x23142e);
      std::
      __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231443);
      peVar6 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffc10);
      local_110 = (*peVar7->_vptr_state_machine[0xe])
                            (peVar7,peVar6,local_c8,local_c0._0_8_,local_108,&local_109);
      if (local_110 < 0) {
        if (((peer *)local_c0._8_8_ != (peer *)0x0) &&
           (iVar3 = (*(*(_func_int ***)local_c0._8_8_)[7])(), uVar1 = local_c0._8_8_, 2 < iVar3)) {
          in_stack_fffffffffffffc08 =
               (raft_server *)CONCAT44((int)((ulong)in_stack_fffffffffffffc08 >> 0x20),local_110);
          msg_if_given_abi_cxx11_
                    (local_148 + 0x18,
                     "reading snapshot (idx %lu, term %lu, object %lu) for peer %d failed: %d",
                     local_f0,local_f8.super___atomic_base<unsigned_long>._M_i,local_c0._0_8_,
                     (ulong)(uint)local_c0.__data.__list.__next._4_4_);
          (*(*(_func_int ***)uVar1)[8])
                    (uVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                     ,"async_io_loop",0xca,local_148 + 0x18);
          std::__cxx11::string::~string((string *)(local_148 + 0x18));
        }
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2315c4);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2315cc);
        std::unique_lock<std::recursive_mutex>::unique_lock
                  ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffc10,
                   (mutex_type *)in_stack_fffffffffffffc08);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2315f2);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2315fa);
        local_148._0_8_ =
             std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                     *)in_stack_fffffffffffffc08,(key_type *)0x231611);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231638);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231640);
        local_150._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                    *)in_stack_fffffffffffffc08);
        bVar2 = std::__detail::operator!=
                          ((_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                            *)local_148,&local_150);
        if (bVar2) {
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x23167f);
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231687);
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x23169c);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    in_stack_fffffffffffffc10);
          raft_server::clear_snapshot_sync_ctx(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        }
        else {
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2316f2);
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2316fa);
          std::atomic<bool>::operator=
                    ((atomic<bool> *)in_stack_fffffffffffffc10,
                     SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x23171b);
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231723);
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x231738);
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231740);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    in_stack_fffffffffffffc10);
          raft_server::enable_hb_for_peer(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        }
        local_154 = 5;
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffc10);
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_108);
        if (bVar2) {
          std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2317a0);
          nuraft::buffer::pos((buffer *)in_stack_fffffffffffffc30,
                              CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        }
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2317bd);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2317c5);
        std::unique_lock<std::recursive_mutex>::unique_lock
                  ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffc10,
                   (mutex_type *)in_stack_fffffffffffffc08);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2317eb);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2317f3);
        std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231802);
        in_stack_fffffffffffffca0 = (raft_server *)srv_state::get_term((srv_state *)0x23180a);
        local_1a8._56_8_ = in_stack_fffffffffffffca0;
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231831);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x231839);
        local_1a8._48_8_ =
             std::__atomic_base::operator_cast_to_unsigned_long
                       ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc18._M_node);
        in_stack_fffffffffffffc98 = (peer *)operator_new(0x30);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231871);
        snapshot_sync_req::snapshot_sync_req
                  ((snapshot_sync_req *)in_stack_fffffffffffffc30,
                   (ptr<snapshot> *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                   in_stack_fffffffffffffc20,(ptr<buffer> *)in_stack_fffffffffffffc18._M_node,
                   SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
        std::unique_ptr<nuraft::snapshot_sync_req,std::default_delete<nuraft::snapshot_sync_req>>::
        unique_ptr<std::default_delete<nuraft::snapshot_sync_req>,void>
                  ((unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                    *)in_stack_fffffffffffffc10,(pointer)in_stack_fffffffffffffc08);
        local_1a8._20_4_ = 0x10;
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2318d1);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2318d9);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2318f2);
        peVar6 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2318fe);
        local_1a8._8_8_ = snapshot::get_last_log_term(peVar6);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x23192d);
        peVar6 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x231939);
        local_1a8._0_8_ = snapshot::get_last_log_idx(peVar6);
        in_stack_fffffffffffffc10 = (peer *)(local_1a8 + 0x30);
        in_stack_fffffffffffffc08 = (raft_server *)local_1a8;
        cs_new<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int&,unsigned_long,unsigned_long,unsigned_long&>
                  ((unsigned_long *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (msg_type *)in_stack_fffffffffffffc30,
                   (int *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                   (int *)in_stack_fffffffffffffc20,
                   (unsigned_long *)in_stack_fffffffffffffc18._M_node,in_stack_fffffffffffffc50,
                   (unsigned_long *)in_stack_fffffffffffffc58);
        this_01 = std::
                  __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2319b3);
        this_02 = (snapshot_sync_req *)req_msg::log_entries(this_01);
        std::unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
        ::operator->((unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                      *)0x2319cf);
        snapshot_sync_req::serialize(this_02);
        local_1e0[0x17] = 5;
        cs_new<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                  ((unsigned_long *)in_stack_fffffffffffffc18._M_node,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffc10,
                   (log_val_type *)in_stack_fffffffffffffc08);
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     *)in_stack_fffffffffffffc10,(value_type *)in_stack_fffffffffffffc08);
        std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x231a31);
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x231a3e);
        std::
        __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x231a4b);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x231a57);
        bVar2 = peer::make_busy(in_stack_fffffffffffffc10);
        if (bVar2) {
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x231a7f);
          in_stack_fffffffffffffc58 =
               std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x231a8b);
          in_stack_fffffffffffffc50 = (unsigned_long *)0x0;
          in_stack_fffffffffffffc60 = (raft_server *)local_1e0;
          std::shared_ptr<nuraft::req_msg>::shared_ptr
                    ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffc08);
          std::
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          ::function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                      *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          peer::set_rsv_msg((peer *)in_stack_fffffffffffffc20,
                            (ptr<req_msg> *)in_stack_fffffffffffffc18._M_node,
                            (rpc_handler *)in_stack_fffffffffffffc10);
          std::
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                       *)0x231ae5);
          std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x231af2);
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x231aff);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x231b0b);
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x231b1d);
          std::shared_ptr<nuraft::peer>::shared_ptr
                    ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc10,
                     (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc08);
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x231b43);
          peer::send_req(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x231b70);
          std::
          __shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x231b7d);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x231b89);
          peer::reset_ls_timer((peer *)0x231b91);
          if (((peer *)local_c0._8_8_ != (peer *)0x0) &&
             (in_stack_fffffffffffffc3c = (*(*(_func_int ***)local_c0._8_8_)[7])(),
             5 < in_stack_fffffffffffffc3c)) {
            in_stack_fffffffffffffc30 = local_c0._8_8_;
            msg_if_given_abi_cxx11_
                      (&stack0xfffffffffffffdd0,"bg thread sent message to peer %d",
                       (ulong)(uint)local_c0.__data.__list.__next._4_4_);
            (**(code **)((long)&(((((peer *)in_stack_fffffffffffffc30)->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->aux_).field_2 + 8))
                      (in_stack_fffffffffffffc30,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xf5,&stack0xfffffffffffffdd0);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
          }
        }
        else {
          if (((peer *)local_c0._8_8_ != (peer *)0x0) &&
             (in_stack_fffffffffffffc2c = (*(*(_func_int ***)local_c0._8_8_)[7])(),
             4 < in_stack_fffffffffffffc2c)) {
            in_stack_fffffffffffffc20 = local_c0._8_8_;
            msg_if_given_abi_cxx11_
                      ((char *)local_250,"peer %d is busy, push the request back to queue",
                       (ulong)(uint)local_c0.__data.__list.__next._4_4_);
            (**(code **)((long)&(((((peer *)in_stack_fffffffffffffc20)->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->aux_).field_2 + 8))
                      (in_stack_fffffffffffffc20,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xf8,local_250);
            std::__cxx11::string::~string(local_250);
          }
          std::__cxx11::
          list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
          ::push_back((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                       *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18._M_node);
        }
        std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x231e5e);
        std::unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
        ::~unique_ptr((unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                       *)in_stack_fffffffffffffc10);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffc10);
        local_154 = 0;
      }
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x231e90);
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffc10);
      std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator++
                ((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_> *)
                 &((__native_type *)local_88)->__data);
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffc10,
               (mutex_type *)in_stack_fffffffffffffc08);
    local_260 = local_58;
    local_268._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
         ::begin((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                  *)in_stack_fffffffffffffc08);
    local_270._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
         ::end((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)in_stack_fffffffffffffc08);
    while (bVar2 = std::operator!=(&local_268,&local_270), bVar2) {
      local_278 = std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::
                  operator*((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>
                             *)0x231f86);
      local_280._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
           ::begin((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                    *)in_stack_fffffffffffffc08);
      while( true ) {
        local_288._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
             ::end((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                    *)in_stack_fffffffffffffc08);
        bVar2 = std::operator!=(&local_280,&local_288);
        if (!bVar2) break;
        std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator*
                  ((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_> *)
                   0x231feb);
        bVar2 = std::operator==((shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)
                                in_stack_fffffffffffffc10,
                                (shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)
                                in_stack_fffffffffffffc08);
        if (bVar2) {
          in_stack_fffffffffffffc18._M_node = (_List_node_base *)(in_RDI + 0x20);
          std::_List_const_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::
          _List_const_iterator(&local_298,&local_280);
          local_290 = (_List_node_base *)
                      std::__cxx11::
                      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                      ::erase((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                               *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc18);
          local_280._M_node = local_290;
          break;
        }
        local_2a0 = (_List_node_base *)
                    std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::
                    operator++(&local_280,0);
      }
      std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator++
                (&local_268);
    }
    local_2a8 = &(((__native_type *)local_88)->__data).__list;
    local_2b0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
         ::begin((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                  *)in_stack_fffffffffffffc08);
    local_2b8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
         ::end((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)in_stack_fffffffffffffc08);
    while (bVar2 = std::operator!=(&local_2b0,&local_2b8), bVar2) {
      std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator*
                ((_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_> *)
                 0x2320e5);
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::push_back((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18._M_node);
      std::_List_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>::operator++
                (&local_2b0);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x232149);
    std::__cxx11::
    list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::~list((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
             *)0x232156);
    std::__cxx11::
    list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::~list((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
             *)0x232163);
    bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc18._M_node);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::~string(local_28);
      return;
    }
  } while( true );
}

Assistant:

void snapshot_io_mgr::async_io_loop() {
    std::string thread_name = "nuraft_snp_io";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    do {
        io_thread_ea_->wait_ms(1000);
        io_thread_ea_->reset();

        std::list< ptr<io_queue_elem> > reqs;
        std::list< ptr<io_queue_elem> > reqs_to_return;
        if (!terminating_) {
            auto_lock(queue_lock_);
            reqs = queue_;
        }

        for (ptr<io_queue_elem>& elem: reqs) {
            if (terminating_) {
                break;
            }
            if (!elem->raft_->is_leader()) {
                break;
            }

            int dst_id = elem->dst_->get_id();

            std::unique_lock<std::mutex> lock(elem->dst_->get_lock());
            // ---- lock acquired
            logger* l_ = elem->raft_->l_.get();
            ulong obj_idx = elem->sync_ctx_->get_offset();
            void*& user_snp_ctx = elem->sync_ctx_->get_user_snp_ctx();
            p_db("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
                 dst_id, obj_idx, user_snp_ctx);

            ulong snp_log_idx = elem->snapshot_->get_last_log_idx();
            ulong snp_log_term = elem->snapshot_->get_last_log_term();
            // ---- lock released
            lock.unlock();

            ptr<buffer> data = nullptr;
            bool is_last_request = false;

            int rc = elem->raft_->state_machine_->read_logical_snp_obj
                     ( *elem->snapshot_, user_snp_ctx, obj_idx,
                       data, is_last_request );
            if (rc < 0) {
                // Snapshot read failed.
                p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                      ", object %" PRIu64 ") "
                      "for peer %d failed: %d",
                      snp_log_idx, snp_log_term, obj_idx, dst_id, rc );

                recur_lock(elem->raft_->lock_);
                auto entry = elem->raft_->peers_.find(dst_id);
                if (entry != elem->raft_->peers_.end()) {
                    // If normal member (already in the peer list):
                    //   reset the `sync_ctx` so as to retry with the newer version.
                    elem->raft_->clear_snapshot_sync_ctx(*elem->dst_);
                } else {
                    // If it is joing the server (not in the peer list),
                    // enable HB temporarily to retry the request.
                    elem->raft_->srv_to_join_snp_retry_required_ = true;
                    elem->raft_->enable_hb_for_peer(*elem->raft_->srv_to_join_);
                }

                continue;
            }
            if (data) data->pos(0);

            // Send snapshot message with the given response handler.
            recur_lock(elem->raft_->lock_);
            ulong term = elem->raft_->state_->get_term();
            ulong commit_idx = elem->raft_->quick_commit_index_;

            std::unique_ptr<snapshot_sync_req> sync_req(
                new snapshot_sync_req( elem->snapshot_, obj_idx,
                                       data, is_last_request ) );
            ptr<req_msg> req( cs_new<req_msg>
                              ( term,
                                msg_type::install_snapshot_request,
                                elem->raft_->id_,
                                dst_id,
                                elem->snapshot_->get_last_log_term(),
                                elem->snapshot_->get_last_log_idx(),
                                commit_idx ) );
            req->log_entries().push_back( cs_new<log_entry>
                                          ( term,
                                            sync_req->serialize(),
                                            log_val_type::snp_sync_req ) );
            if (elem->dst_->make_busy()) {
                elem->dst_->set_rsv_msg(nullptr, nullptr);
                elem->dst_->send_req(elem->dst_, req, elem->handler_);
                elem->dst_->reset_ls_timer();
                p_tr("bg thread sent message to peer %d", dst_id);

            } else {
                p_db("peer %d is busy, push the request back to queue", dst_id);
                reqs_to_return.push_back(elem);
            }
        }

        {
            auto_lock(queue_lock_);
            // Remove elements in `reqs` from `queue_`.
            for (auto& entry: reqs) {
                auto e2 = queue_.begin();
                while (e2 != queue_.end()) {
                    if (*e2 == entry) {
                        e2 = queue_.erase(e2);
                        break;
                    } else {
                        e2++;
                    }
                }
            }
            // Return elements in `reqs_to_return` to `queue_` for retrying.
            for (auto& entry: reqs_to_return) {
                queue_.push_back(entry);
            }
        }

    } while (!terminating_);
}